

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O3

bool FIX::BoolConvertor::convert(string *value)

{
  char cVar1;
  bool bVar2;
  FieldConvertError *this;
  
  if (value->_M_string_length == 1) {
    cVar1 = *(value->_M_dataplus)._M_p;
    if (cVar1 == 'N') {
      bVar2 = false;
    }
    else {
      if (cVar1 != 'Y') goto LAB_00157ea0;
      bVar2 = true;
    }
    return bVar2;
  }
LAB_00157ea0:
  this = (FieldConvertError *)__cxa_allocate_exception(0x50);
  FieldConvertError::FieldConvertError(this,value);
  __cxa_throw(this,&FieldConvertError::typeinfo,Exception::~Exception);
}

Assistant:

static bool convert( const std::string& value )
  EXCEPT ( FieldConvertError )
  {
    bool result = false;
    if( !convert( value, result ) )
      throw FieldConvertError(value);
    else
      return result;
  }